

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O3

int64_t __thiscall
disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>::WaitFor
          (SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1> *this,
          int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  function<long_()> min_sequence;
  Sequence *local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  timespec local_40;
  
  bVar5 = (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_finish !=
          (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_start;
  local_58 = 0;
  if (bVar5) {
    cursor = (Sequence *)dependents;
  }
  local_48 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
             ::_M_invoke;
  if (!bVar5) {
    local_48 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
               ::_M_invoke;
  }
  local_50 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
             ::_M_manager;
  if (!bVar5) {
    local_50 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
               ::_M_manager;
  }
  lVar4 = 200;
  local_60 = cursor;
  do {
    lVar2 = (*local_48)(&local_60);
    if (*sequence <= lVar2) goto LAB_001145cd;
    if (((alerted->_M_base)._M_i & 1U) != 0) goto LAB_001145c6;
    lVar4 = (long)(int)lVar4;
    if (lVar4 < 0x65) {
      if (lVar4 < 1) {
        local_40.tv_sec = 0;
        local_40.tv_nsec = 1000000;
        do {
          iVar1 = nanosleep(&local_40,&local_40);
          if (iVar1 != -1) break;
          piVar3 = __errno_location();
        } while (*piVar3 == 4);
      }
      else {
        lVar4 = lVar4 + -1;
        sched_yield();
      }
    }
    else {
      lVar4 = lVar4 + -1;
    }
  } while (local_50 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_001145c6:
  lVar2 = -2;
LAB_001145cd:
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  return lVar2;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted) {
    int64_t available_sequence = kInitialCursorValue;
    int counter = S;

    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      counter = ApplyWaitMethod(counter);
    }

    return available_sequence;
  }